

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction.c
# Opt level: O1

int tx_to_bip143_bytes(wally_tx *tx,tx_serialize_opts *opts,uint32_t flags,uchar *bytes_out,
                      size_t len,size_t *written)

{
  uchar *puVar1;
  uint64_t uVar2;
  wally_tx_input *pwVar3;
  uint64_t uVar4;
  uint uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  tx_serialize_opts *ptVar9;
  leint32_t tmp;
  int iVar10;
  long lVar11;
  size_t sVar12;
  size_t sVar13;
  uchar *bytes;
  size_t sVar14;
  uchar *puVar15;
  size_t sVar16;
  uint uVar17;
  ulong uVar18;
  undefined4 in_register_00000014;
  uint32_t *puVar19;
  uchar *bytes_len;
  uint32_t *bytes_out_00;
  char cVar20;
  uint uVar21;
  long lVar22;
  uint32_t *puVar23;
  ulong uVar24;
  uchar *puVar25;
  uint64_t *bytes_out_01;
  uchar *puVar26;
  uchar *puVar27;
  size_t is_elements;
  uchar buff [1024];
  uchar *local_490;
  size_t local_478;
  uchar *local_470;
  uchar *local_468;
  tx_serialize_opts *local_460;
  uint32_t *local_458;
  uint local_44c;
  uint32_t *local_448;
  uchar *local_440;
  uchar local_438 [1032];
  
  puVar19 = (uint32_t *)CONCAT44(in_register_00000014,flags);
  local_478 = 0;
  uVar21 = opts->sighash;
  iVar10 = wally_tx_is_elements(tx,&local_478);
  if (iVar10 != 0) {
    return iVar10;
  }
  uVar17 = uVar21 & 0x1f;
  *puVar19 = tx->version;
  local_468 = (uchar *)(tx->num_inputs << 2);
  local_460 = opts;
  local_458 = puVar19;
  local_440 = bytes_out;
  if (uVar17 == 2) {
LAB_00400502:
    local_490 = (uchar *)0x0;
    puVar27 = (uchar *)0x0;
  }
  else if (uVar17 == 3) {
    uVar24 = opts->index;
    if (tx->num_outputs <= uVar24) goto LAB_00400502;
    if (local_478 == 0) {
      uVar2 = tx->outputs[uVar24].script_len;
      sVar12 = varint_get_length(uVar2);
      puVar27 = (uchar *)(uVar2 + sVar12 + 8);
      local_490 = (uchar *)0x0;
    }
    else {
      sVar12 = confidential_asset_length_from_bytes(tx->outputs[uVar24].asset);
      sVar13 = confidential_value_length_from_bytes(tx->outputs[opts->index].value);
      sVar16 = confidential_nonce_length_from_bytes(tx->outputs[opts->index].nonce);
      uVar2 = tx->outputs[opts->index].script_len;
      sVar14 = varint_get_length(uVar2);
      puVar27 = (uchar *)(sVar16 + uVar2 + sVar13 + sVar12 + sVar14);
      if ((uVar21 & 0x40) == 0) {
        local_490 = (uchar *)0x0;
      }
      else {
        uVar2 = tx->outputs[opts->index].rangeproof_len;
        sVar12 = varint_get_length(uVar2);
        uVar4 = tx->outputs[opts->index].surjectionproof_len;
        sVar13 = varint_get_length(uVar4);
        local_490 = (uchar *)(uVar2 + uVar4 + sVar12 + sVar13);
      }
    }
  }
  else {
    if (tx->num_outputs == 0) goto LAB_00400502;
    lVar22 = 0;
    uVar24 = 0;
    puVar27 = (uchar *)0x0;
    local_490 = (uchar *)0x0;
    local_44c = uVar21;
    do {
      if (local_478 == 0) {
        lVar11 = 8;
      }
      else {
        sVar12 = confidential_asset_length_from_bytes
                           (*(uchar **)((long)&tx->outputs->asset + lVar22));
        sVar13 = confidential_value_length_from_bytes
                           (*(uchar **)((long)&tx->outputs->value + lVar22));
        sVar16 = confidential_nonce_length_from_bytes
                           (*(uchar **)((long)&tx->outputs->nonce + lVar22));
        lVar11 = sVar16 + sVar13 + sVar12;
        uVar5 = uVar21 & 0x40;
        uVar21 = local_44c;
        if (uVar5 != 0) {
          uVar2 = *(uint64_t *)((long)&tx->outputs->rangeproof_len + lVar22);
          local_470 = (uchar *)varint_get_length(uVar2);
          uVar4 = *(uint64_t *)((long)&tx->outputs->surjectionproof_len + lVar22);
          sVar12 = varint_get_length(uVar4);
          local_490 = local_470 + (long)(local_490 + sVar12 + uVar4 + uVar2);
          uVar21 = local_44c;
        }
      }
      uVar2 = *(uint64_t *)((long)&tx->outputs->script_len + lVar22);
      sVar12 = varint_get_length(uVar2);
      puVar27 = puVar27 + sVar12 + uVar2 + lVar11;
      uVar24 = uVar24 + 1;
      lVar22 = lVar22 + 0x70;
    } while (uVar24 < tx->num_outputs);
  }
  puVar26 = (uchar *)((long)local_468 * 9);
  cVar20 = (char)uVar21;
  if ((local_478 == 0 || cVar20 < '\0') || (tx->num_inputs == 0)) {
    bytes_len = (uchar *)0x0;
  }
  else {
    lVar22 = 0;
    uVar24 = 0;
    bytes_len = (uchar *)0x0;
    do {
      lVar11 = 1;
      if ((tx->inputs->blinding_nonce[lVar22 + -1] & 2) != 0) {
        sVar12 = confidential_value_length_from_bytes
                           (*(uchar **)(tx->inputs->entropy + lVar22 + 0x27));
        sVar13 = confidential_value_length_from_bytes
                           (*(uchar **)(tx->inputs->entropy + lVar22 + 0x37));
        lVar11 = sVar13 + sVar12 + 0x40;
      }
      bytes_len = bytes_len + lVar11;
      uVar24 = uVar24 + 1;
      lVar22 = lVar22 + 0xd0;
    } while (uVar24 < tx->num_inputs);
  }
  if ((((puVar26 < (uchar *)0x401) && (puVar27 < (uchar *)0x401)) && (local_490 < (uchar *)0x401))
     && (bytes_len < (uchar *)0x401)) {
    bytes = local_438;
    puVar25 = (uchar *)0x400;
  }
  else {
    puVar25 = puVar27;
    if (puVar27 < puVar26) {
      puVar25 = puVar26;
    }
    if (puVar25 <= local_490) {
      puVar25 = local_490;
    }
    if (puVar25 <= bytes_len) {
      puVar25 = bytes_len;
    }
    bytes = (uchar *)wally_malloc((size_t)puVar25);
    if (bytes == (uchar *)0x0) {
      return -3;
    }
  }
  puVar23 = local_458;
  puVar19 = local_458 + 1;
  if (cVar20 < '\0') {
    puVar23[5] = 0;
    puVar23[6] = 0;
    puVar23[7] = 0;
    puVar23[8] = 0;
    puVar19[0] = 0;
    puVar19[1] = 0;
    puVar23[3] = 0;
    puVar23[4] = 0;
  }
  else {
    if (tx->num_inputs != 0) {
      puVar15 = bytes + 0x20;
      lVar22 = 0;
      uVar24 = 0;
      do {
        puVar1 = tx->inputs->txhash + lVar22;
        uVar6 = *(undefined8 *)puVar1;
        uVar7 = *(undefined8 *)(puVar1 + 8);
        puVar1 = tx->inputs->txhash + lVar22 + 0x10;
        uVar8 = *(undefined8 *)(puVar1 + 8);
        *(undefined8 *)(puVar15 + -0x10) = *(undefined8 *)puVar1;
        *(undefined8 *)(puVar15 + -8) = uVar8;
        *(undefined8 *)(puVar15 + -0x20) = uVar6;
        *(undefined8 *)(puVar15 + -0x18) = uVar7;
        *(undefined4 *)puVar15 = *(undefined4 *)(tx->inputs->txhash + lVar22 + 0x20);
        uVar24 = uVar24 + 1;
        lVar22 = lVar22 + 0xd0;
        puVar15 = puVar15 + 0x24;
      } while (uVar24 < tx->num_inputs);
    }
    iVar10 = wally_sha256d(bytes,(size_t)puVar26,(uchar *)puVar19,0x20);
    if (iVar10 != 0) goto LAB_00400d73;
  }
  puVar19 = puVar23 + 9;
  if ((uVar21 & 0x1e) == 2 || cVar20 < '\0') {
    puVar23[0xd] = 0;
    puVar23[0xe] = 0;
    puVar23[0xf] = 0;
    puVar23[0x10] = 0;
    puVar19[0] = 0;
    puVar19[1] = 0;
    puVar23[0xb] = 0;
    puVar23[0xc] = 0;
  }
  else {
    uVar24 = tx->num_inputs;
    if (uVar24 != 0) {
      lVar22 = 9;
      uVar18 = 0;
      do {
        *(undefined4 *)(bytes + uVar18 * 4) = *(undefined4 *)(tx->inputs->txhash + lVar22 * 4);
        uVar18 = uVar18 + 1;
        uVar24 = tx->num_inputs;
        lVar22 = lVar22 + 0x34;
      } while (uVar18 < uVar24);
    }
    iVar10 = wally_sha256d(bytes,uVar24 << 2,(uchar *)puVar19,0x20);
    if (iVar10 != 0) goto LAB_00400d73;
  }
  puVar19 = puVar23 + 0x11;
  local_470 = bytes;
  local_468 = puVar25;
  if (local_478 == 0) {
    iVar10 = 0;
  }
  else {
    if (cVar20 < '\0') {
      puVar23[0x15] = 0;
      puVar23[0x16] = 0;
      puVar23[0x17] = 0;
      puVar23[0x18] = 0;
      puVar19[0] = 0;
      puVar19[1] = 0;
      puVar23[0x13] = 0;
      puVar23[0x14] = 0;
      iVar10 = 0;
    }
    else {
      local_448 = puVar19;
      if (tx->num_inputs != 0) {
        lVar22 = 0;
        uVar24 = 0;
        puVar26 = bytes;
        do {
          pwVar3 = tx->inputs;
          if ((pwVar3->blinding_nonce[lVar22 + -1] & 2) == 0) {
            *puVar26 = '\0';
            puVar26 = puVar26 + 1;
          }
          else {
            uVar6 = *(undefined8 *)(pwVar3->blinding_nonce + lVar22);
            uVar7 = *(undefined8 *)(pwVar3->blinding_nonce + lVar22 + 8);
            uVar8 = *(undefined8 *)(pwVar3->blinding_nonce + lVar22 + 0x10 + 8);
            *(undefined8 *)(puVar26 + 0x10) =
                 *(undefined8 *)(pwVar3->blinding_nonce + lVar22 + 0x10);
            *(undefined8 *)(puVar26 + 0x18) = uVar8;
            *(undefined8 *)puVar26 = uVar6;
            *(undefined8 *)(puVar26 + 8) = uVar7;
            puVar25 = tx->inputs->entropy + lVar22;
            uVar6 = *(undefined8 *)puVar25;
            uVar7 = *(undefined8 *)(puVar25 + 8);
            puVar25 = tx->inputs->entropy + lVar22 + 0x10;
            uVar8 = *(undefined8 *)(puVar25 + 8);
            *(undefined8 *)(puVar26 + 0x30) = *(undefined8 *)puVar25;
            *(undefined8 *)(puVar26 + 0x38) = uVar8;
            *(undefined8 *)(puVar26 + 0x20) = uVar6;
            *(undefined8 *)(puVar26 + 0x28) = uVar7;
            sVar12 = confidential_value_to_bytes
                               (*(uchar **)(tx->inputs->entropy + lVar22 + 0x27),
                                *(size_t *)(tx->inputs->entropy + lVar22 + 0x2f),puVar26 + 0x40);
            sVar13 = confidential_value_to_bytes
                               (*(uchar **)(tx->inputs->entropy + lVar22 + 0x37),
                                *(size_t *)(tx->inputs->entropy + lVar22 + 0x3f),
                                puVar26 + sVar12 + 0x40);
            puVar26 = puVar26 + sVar12 + 0x40 + sVar13;
            bytes = local_470;
          }
          uVar24 = uVar24 + 1;
          lVar22 = lVar22 + 0xd0;
        } while (uVar24 < tx->num_inputs);
      }
      iVar10 = wally_sha256d(bytes,(size_t)bytes_len,(uchar *)local_448,0x20);
      puVar23 = local_458;
      puVar25 = local_468;
      if (iVar10 != 0) goto LAB_00400d73;
    }
    puVar19 = puVar23 + 0x19;
  }
  ptVar9 = local_460;
  pwVar3 = tx->inputs + local_460->index;
  uVar6 = *(undefined8 *)pwVar3->txhash;
  uVar7 = *(undefined8 *)(pwVar3->txhash + 8);
  puVar26 = tx->inputs[local_460->index].txhash + 0x10;
  uVar8 = *(undefined8 *)(puVar26 + 8);
  *(undefined8 *)(puVar19 + 4) = *(undefined8 *)puVar26;
  *(undefined8 *)(puVar19 + 6) = uVar8;
  *(undefined8 *)puVar19 = uVar6;
  *(undefined8 *)(puVar19 + 2) = uVar7;
  puVar19[8] = tx->inputs[local_460->index].index;
  sVar12 = varbuff_to_bytes(local_460->script,local_460->script_len,(uchar *)(puVar19 + 9));
  bytes_out_01 = (uint64_t *)((long)puVar19 + sVar12 + 0x24);
  if (local_478 == 0) {
    *bytes_out_01 = ptVar9->satoshi;
    sVar12 = 8;
  }
  else {
    sVar12 = confidential_value_to_bytes(ptVar9->value,ptVar9->value_len,(uchar *)bytes_out_01);
  }
  puVar19 = (uint32_t *)((long)bytes_out_01 + sVar12);
  bytes_out_00 = puVar19 + 1;
  *puVar19 = tx->inputs[ptVar9->index].sequence;
  if (local_478 != 0) {
    pwVar3 = tx->inputs;
    sVar13 = ptVar9->index;
    if ((pwVar3[sVar13].features & 2) != 0) {
      uVar6 = *(undefined8 *)pwVar3[sVar13].blinding_nonce;
      uVar7 = *(undefined8 *)(pwVar3[sVar13].blinding_nonce + 8);
      uVar8 = *(undefined8 *)(pwVar3[sVar13].blinding_nonce + 0x18);
      *(undefined8 *)(puVar19 + 5) = *(undefined8 *)(pwVar3[sVar13].blinding_nonce + 0x10);
      *(undefined8 *)(puVar19 + 7) = uVar8;
      *(undefined8 *)bytes_out_00 = uVar6;
      *(undefined8 *)(puVar19 + 3) = uVar7;
      puVar26 = tx->inputs[ptVar9->index].entropy;
      uVar6 = *(undefined8 *)puVar26;
      uVar7 = *(undefined8 *)(puVar26 + 8);
      puVar26 = tx->inputs[ptVar9->index].entropy + 0x10;
      uVar8 = *(undefined8 *)(puVar26 + 8);
      *(undefined8 *)((long)bytes_out_01 + sVar12 + 0x34) = *(undefined8 *)puVar26;
      *(undefined8 *)((long)bytes_out_01 + sVar12 + 0x3c) = uVar8;
      *(undefined8 *)((long)bytes_out_01 + sVar12 + 0x24) = uVar6;
      *(undefined8 *)((long)bytes_out_01 + sVar12 + 0x2c) = uVar7;
      sVar13 = confidential_value_to_bytes
                         (tx->inputs[ptVar9->index].issuance_amount,
                          tx->inputs[ptVar9->index].issuance_amount_len,
                          (uchar *)((long)bytes_out_01 + sVar12 + 0x44));
      puVar26 = (uchar *)((long)bytes_out_01 + sVar13 + sVar12 + 0x44);
      sVar12 = confidential_value_to_bytes
                         (tx->inputs[ptVar9->index].inflation_keys,
                          tx->inputs[ptVar9->index].inflation_keys_len,puVar26);
      bytes_out_00 = (uint32_t *)(puVar26 + sVar12);
    }
  }
  if ((uVar17 == 2) || ((uVar17 == 3 && (tx->num_outputs <= local_460->index)))) {
    bytes_out_00[4] = 0;
    bytes_out_00[5] = 0;
    bytes_out_00[6] = 0;
    bytes_out_00[7] = 0;
    bytes_out_00[0] = 0;
    bytes_out_00[1] = 0;
    bytes_out_00[2] = 0;
    bytes_out_00[3] = 0;
    bytes = local_470;
  }
  else {
    if (tx->num_outputs != 0) {
      lVar22 = 0;
      sVar12 = 0;
      puVar26 = local_470;
      do {
        if ((uVar17 != 3) || (sVar12 == local_460->index)) {
          if (local_478 == 0) {
            *(undefined8 *)puVar26 = *(undefined8 *)((long)&tx->outputs->satoshi + lVar22);
            puVar26 = puVar26 + 8;
          }
          else {
            sVar13 = confidential_value_to_bytes
                               (*(uchar **)((long)&tx->outputs->asset + lVar22),
                                *(size_t *)((long)&tx->outputs->asset_len + lVar22),puVar26);
            puVar26 = puVar26 + sVar13;
            sVar13 = confidential_value_to_bytes
                               (*(uchar **)((long)&tx->outputs->value + lVar22),
                                *(size_t *)((long)&tx->outputs->value_len + lVar22),puVar26);
            sVar16 = confidential_value_to_bytes
                               (*(uchar **)((long)&tx->outputs->nonce + lVar22),
                                *(size_t *)((long)&tx->outputs->nonce_len + lVar22),puVar26 + sVar13
                               );
            puVar26 = puVar26 + sVar13 + sVar16;
          }
          sVar13 = varbuff_to_bytes(*(uchar **)((long)&tx->outputs->script + lVar22),
                                    *(size_t *)((long)&tx->outputs->script_len + lVar22),puVar26);
          puVar26 = puVar26 + sVar13;
        }
        sVar12 = sVar12 + 1;
        lVar22 = lVar22 + 0x70;
      } while (sVar12 < tx->num_outputs);
    }
    bytes = local_470;
    iVar10 = wally_sha256d(local_470,(size_t)puVar27,(uchar *)bytes_out_00,0x20);
    puVar25 = local_468;
    if (iVar10 != 0) goto LAB_00400d73;
    iVar10 = 0;
    puVar23 = local_458;
  }
  puVar19 = bytes_out_00 + 8;
  if (local_478 != 0 && (uVar21 & 0x40) != 0) {
    if ((uVar17 == 2) || ((uVar17 == 3 && (tx->num_outputs <= local_460->index)))) {
      bytes_out_00[0xc] = 0;
      bytes_out_00[0xd] = 0;
      bytes_out_00[0xe] = 0;
      bytes_out_00[0xf] = 0;
      puVar19[0] = 0;
      puVar19[1] = 0;
      bytes_out_00[10] = 0;
      bytes_out_00[0xb] = 0;
    }
    else {
      if (tx->num_outputs != 0) {
        lVar22 = 0;
        uVar24 = 0;
        puVar27 = bytes;
        do {
          if ((uVar17 != 3) || (uVar24 == local_460->index)) {
            sVar12 = varbuff_to_bytes(*(uchar **)((long)&tx->outputs->rangeproof + lVar22),
                                      *(size_t *)((long)&tx->outputs->rangeproof_len + lVar22),
                                      puVar27);
            sVar13 = varbuff_to_bytes(*(uchar **)((long)&tx->outputs->surjectionproof + lVar22),
                                      *(size_t *)((long)&tx->outputs->surjectionproof_len + lVar22),
                                      puVar27 + sVar12);
            puVar27 = puVar27 + sVar12 + sVar13;
            bytes = local_470;
          }
          uVar24 = uVar24 + 1;
          lVar22 = lVar22 + 0x70;
        } while (uVar24 < tx->num_outputs);
      }
      iVar10 = wally_sha256d(bytes,(size_t)local_490,(uchar *)puVar19,0x20);
      puVar25 = local_468;
      if (iVar10 != 0) goto LAB_00400d73;
      iVar10 = 0;
      puVar23 = local_458;
    }
    puVar19 = bytes_out_00 + 0x10;
  }
  *puVar19 = tx->locktime;
  puVar19[1] = local_460->tx_sighash;
  *(uchar **)local_440 = (uchar *)((long)puVar19 + (8 - (long)puVar23));
  puVar25 = local_468;
LAB_00400d73:
  if (bytes == local_438) {
    wally_clear(local_438,0x400);
  }
  else {
    clear_and_free(bytes,(size_t)puVar25);
  }
  return iVar10;
}

Assistant:

static inline int tx_to_bip143_bytes(const struct wally_tx *tx,
                                     const struct tx_serialize_opts *opts,
                                     uint32_t flags,
                                     unsigned char *bytes_out, size_t len,
                                     size_t *written)
{
    unsigned char buff[TX_STACK_SIZE / 2], *buff_p = buff;
    size_t i, inputs_size, outputs_size, rangeproof_size = 0, issuances_size = 0, buff_len = sizeof(buff);
    size_t is_elements = 0;
    const bool anyonecanpay = opts->sighash & WALLY_SIGHASH_ANYONECANPAY;
#ifdef BUILD_ELEMENTS
    const bool sh_rangeproof = opts->sighash & WALLY_SIGHASH_RANGEPROOF;
#endif
    const bool sh_none = (opts->sighash & SIGHASH_MASK) == WALLY_SIGHASH_NONE;
    const bool sh_single = (opts->sighash & SIGHASH_MASK) == WALLY_SIGHASH_SINGLE;
    unsigned char *p = bytes_out, *output_p;
    int ret = WALLY_OK;

    (void)flags;
    (void)len;

#ifdef BUILD_ELEMENTS
    if ((ret = wally_tx_is_elements(tx, &is_elements)) != WALLY_OK)
        return ret;
#endif

    /* Note we assume tx_to_bytes has already validated all inputs */
    p += uint32_to_le_bytes(tx->version, p);

    inputs_size = tx->num_inputs * (WALLY_TXHASH_LEN + sizeof(uint32_t));
    if (sh_none || (sh_single && opts->index >= tx->num_outputs))
        outputs_size = 0;
    else if (sh_single) {
        if (!is_elements)
            outputs_size = sizeof(uint64_t) +
                           varbuff_get_length(tx->outputs[opts->index].script_len);
#ifdef BUILD_ELEMENTS
        else {
            outputs_size = confidential_asset_length_from_bytes(tx->outputs[opts->index].asset) +
                           confidential_value_length_from_bytes(tx->outputs[opts->index].value) +
                           confidential_nonce_length_from_bytes(tx->outputs[opts->index].nonce) +
                           varbuff_get_length(tx->outputs[opts->index].script_len);

            if (sh_rangeproof) {
                rangeproof_size = varbuff_get_length(tx->outputs[opts->index].rangeproof_len) +
                                  varbuff_get_length(tx->outputs[opts->index].surjectionproof_len);
            }
        }
#else
        else
            return WALLY_EINVAL;
#endif
    } else {
        outputs_size = 0;
        rangeproof_size = 0;
        for (i = 0; i < tx->num_outputs; ++i) {
            if (!is_elements)
                outputs_size += sizeof(uint64_t);
#ifdef BUILD_ELEMENTS
            else {
                outputs_size += confidential_asset_length_from_bytes(tx->outputs[i].asset) +
                                confidential_value_length_from_bytes(tx->outputs[i].value) +
                                confidential_nonce_length_from_bytes(tx->outputs[i].nonce);

                if (sh_rangeproof) {
                    rangeproof_size += varbuff_get_length(tx->outputs[i].rangeproof_len) +
                                       varbuff_get_length(tx->outputs[i].surjectionproof_len);
                }
            }
#else
            else
                return WALLY_EINVAL;
#endif
            outputs_size += varbuff_get_length(tx->outputs[i].script_len);
        }
    }

#ifdef BUILD_ELEMENTS
    if (is_elements && !anyonecanpay) {
        for (i = 0; i < tx->num_inputs; ++i) {
            if (tx->inputs[i].features & WALLY_TX_IS_ISSUANCE)
                issuances_size +=
                    2 * WALLY_TX_ASSET_TAG_LEN +
                    confidential_value_length_from_bytes(tx->inputs[i].issuance_amount) +
                    confidential_value_length_from_bytes(tx->inputs[i].inflation_keys);
            else
                issuances_size += 1;
        }
    }
#endif

    if (inputs_size > buff_len || outputs_size > buff_len ||
        rangeproof_size > buff_len || issuances_size > buff_len) {
        buff_len = inputs_size > outputs_size ? inputs_size : outputs_size;
        buff_len = buff_len > rangeproof_size ? buff_len : rangeproof_size;
        buff_len = buff_len > issuances_size ? buff_len : issuances_size;
        buff_p = wally_malloc(buff_len);
        if (buff_p == NULL)
            return WALLY_ENOMEM;
    }

    /* Inputs */
    if (anyonecanpay)
        memset(p, 0, SHA256_LEN);
    else {
        for (i = 0; i < tx->num_inputs; ++i) {
            unsigned char *tmp_p = buff_p + i * (WALLY_TXHASH_LEN + sizeof(uint32_t));
            memcpy(tmp_p, tx->inputs[i].txhash, WALLY_TXHASH_LEN);
            uint32_to_le_bytes(tx->inputs[i].index, tmp_p + WALLY_TXHASH_LEN);
        }

        if ((ret = wally_sha256d(buff_p, inputs_size, p, SHA256_LEN)) != WALLY_OK)
            goto error;
    }
    p += SHA256_LEN;

    /* Sequences */
    if (anyonecanpay || sh_single || sh_none)
        memset(p, 0, SHA256_LEN);
    else {
        for (i = 0; i < tx->num_inputs; ++i)
            uint32_to_le_bytes(tx->inputs[i].sequence, buff_p + i * sizeof(uint32_t));

        ret = wally_sha256d(buff_p, tx->num_inputs * sizeof(uint32_t), p, SHA256_LEN);
        if (ret != WALLY_OK)
            goto error;
    }
    p += SHA256_LEN;

#ifdef BUILD_ELEMENTS
    if (is_elements) {
        /* Issuance */
        if (anyonecanpay)
            memset(p, 0, SHA256_LEN);
        else {
            unsigned char *tmp_p = buff_p;
            for (i = 0; i < tx->num_inputs; ++i) {
                if (tx->inputs[i].features & WALLY_TX_IS_ISSUANCE) {
                    memcpy(tmp_p, tx->inputs[i].blinding_nonce, WALLY_TX_ASSET_TAG_LEN);
                    tmp_p += WALLY_TX_ASSET_TAG_LEN;
                    memcpy(tmp_p, tx->inputs[i].entropy, WALLY_TX_ASSET_TAG_LEN);
                    tmp_p += WALLY_TX_ASSET_TAG_LEN;
                    tmp_p += confidential_value_to_bytes(tx->inputs[i].issuance_amount,
                                                         tx->inputs[i].issuance_amount_len, tmp_p);
                    tmp_p += confidential_value_to_bytes(tx->inputs[i].inflation_keys,
                                                         tx->inputs[i].inflation_keys_len, tmp_p);
                }
                else
                    *tmp_p++ = 0;
            }

            if ((ret = wally_sha256d(buff_p, issuances_size, p, SHA256_LEN)) != WALLY_OK)
                goto error;
        }
        p += SHA256_LEN;
    }
#endif /* BUILD_ELEMENTS */

    /* Input details */
    memcpy(p, tx->inputs[opts->index].txhash, WALLY_TXHASH_LEN);
    p += WALLY_TXHASH_LEN;
    p += uint32_to_le_bytes(tx->inputs[opts->index].index, p);
    p += varbuff_to_bytes(opts->script, opts->script_len, p);
    if (!is_elements)
        p += uint64_to_le_bytes(opts->satoshi, p);
#ifdef BUILD_ELEMENTS
    else
        p += confidential_value_to_bytes(opts->value, opts->value_len, p);
#endif
    p += uint32_to_le_bytes(tx->inputs[opts->index].sequence, p);

#ifdef BUILD_ELEMENTS
    if (is_elements && (tx->inputs[opts->index].features & WALLY_TX_IS_ISSUANCE)) {
        memcpy(p, tx->inputs[opts->index].blinding_nonce, WALLY_TX_ASSET_TAG_LEN);
        p += WALLY_TX_ASSET_TAG_LEN;
        memcpy(p, tx->inputs[opts->index].entropy, WALLY_TX_ASSET_TAG_LEN);
        p += WALLY_TX_ASSET_TAG_LEN;
        p += confidential_value_to_bytes(tx->inputs[opts->index].issuance_amount,
                                         tx->inputs[opts->index].issuance_amount_len, p);
        p += confidential_value_to_bytes(tx->inputs[opts->index].inflation_keys,
                                         tx->inputs[opts->index].inflation_keys_len, p);
    }
#endif

    /* Outputs */
    if (sh_none || (sh_single && opts->index >= tx->num_outputs))
        memset(p, 0, SHA256_LEN);
    else {
        output_p = buff_p;
        for (i = 0; i < tx->num_outputs; ++i) {
            if (sh_single && i != opts->index)
                continue;
            if (!is_elements)
                output_p += uint64_to_le_bytes(tx->outputs[i].satoshi, output_p);
#ifdef BUILD_ELEMENTS
            else {
                output_p += confidential_value_to_bytes(tx->outputs[i].asset, tx->outputs[i].asset_len,
                                                        output_p);
                output_p += confidential_value_to_bytes(tx->outputs[i].value, tx->outputs[i].value_len,
                                                        output_p);
                output_p += confidential_value_to_bytes(tx->outputs[i].nonce, tx->outputs[i].nonce_len,
                                                        output_p);
            }
#endif
            output_p += varbuff_to_bytes(tx->outputs[i].script,
                                         tx->outputs[i].script_len, output_p);
        }

        ret = wally_sha256d(buff_p, outputs_size, p, SHA256_LEN);
        if (ret != WALLY_OK)
            goto error;
    }
    p += SHA256_LEN;

    /* rangeproof */
#ifdef BUILD_ELEMENTS
    if (is_elements && sh_rangeproof) {
        if (sh_none || (sh_single && opts->index >= tx->num_outputs))
            memset(p, 0, SHA256_LEN);
        else {
            output_p = buff_p;
            for (i = 0; i < tx->num_outputs; ++i) {
                if (sh_single && i != opts->index)
                    continue;
                output_p += varbuff_to_bytes(tx->outputs[i].rangeproof,
                                             tx->outputs[i].rangeproof_len, output_p);
                output_p += varbuff_to_bytes(tx->outputs[i].surjectionproof,
                                             tx->outputs[i].surjectionproof_len, output_p);
            }
            ret = wally_sha256d(buff_p, rangeproof_size, p, SHA256_LEN);
            if (ret != WALLY_OK)
                goto error;
        }
        p += SHA256_LEN;
    }
#endif

    /* nlocktime and sighash*/
    p += uint32_to_le_bytes(tx->locktime, p);
    p += uint32_to_le_bytes(opts->tx_sighash, p);

    *written = p - bytes_out;

error:
    if (buff_p != buff)
        clear_and_free(buff_p, buff_len);
    else
        wally_clear(buff, sizeof(buff));
    return ret;
}